

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

double __thiscall
NEST::NESTcalc::RecombOmegaNR
          (NESTcalc *this,double elecFrac,vector<double,_std::allocator<double>_> *NRERWidthsParam)

{
  const_reference pvVar1;
  double dVar2;
  double dVar3;
  undefined8 local_28;
  double omega;
  vector<double,_std::allocator<double>_> *NRERWidthsParam_local;
  double elecFrac_local;
  NESTcalc *this_local;
  
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,2);
  local_28 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,3);
  dVar2 = pow(elecFrac - *pvVar1,2.0);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,4);
  dVar3 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](NRERWidthsParam,4);
  dVar3 = exp((dVar2 * -0.5) / (dVar3 * *pvVar1));
  local_28 = local_28 * dVar3;
  if (local_28 < 0.0) {
    local_28 = 0.0;
  }
  return local_28;
}

Assistant:

double NESTcalc::RecombOmegaNR(double elecFrac,
                               const std::vector<double> &NRERWidthsParam) {
  double omega =
      NRERWidthsParam[2] * exp(-0.5 * pow(elecFrac - NRERWidthsParam[3], 2.) /
                               (NRERWidthsParam[4] * NRERWidthsParam[4]));
  if (omega < 0.) omega = 0;
  return omega;
}